

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckFunctions.cxx
# Opt level: O0

bool __thiscall kws::Parser::CheckFunctions(Parser *this,char *regEx,unsigned_long maxLength)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  value_type *__s;
  long in_RDX;
  char *in_RSI;
  long in_RDI;
  char *temp_1;
  size_t length_1;
  Error error_1;
  Error error;
  long localbf;
  long efl;
  long poscomments;
  long pos2_1;
  long bfl;
  long bfcomments;
  long bf_1;
  long pos2;
  long bf;
  long posp;
  long posf;
  string functionLine;
  bool inWord;
  long i;
  string functionName;
  long pos;
  RegularExpression regex;
  bool hasError;
  char *temp;
  size_t length;
  string *in_stack_fffffffffffff9e8;
  undefined7 in_stack_fffffffffffff9f0;
  undefined1 in_stack_fffffffffffff9f7;
  value_type *in_stack_fffffffffffff9f8;
  string *in_stack_fffffffffffffa00;
  value_type *in_stack_fffffffffffffa08;
  string *in_stack_fffffffffffffa10;
  undefined7 in_stack_fffffffffffffa18;
  undefined1 in_stack_fffffffffffffa1f;
  Parser *in_stack_fffffffffffffa20;
  Parser *in_stack_fffffffffffffa28;
  size_t in_stack_fffffffffffffa40;
  Parser *in_stack_fffffffffffffa48;
  size_t in_stack_fffffffffffffa60;
  Parser *in_stack_fffffffffffffa68;
  size_t in_stack_fffffffffffffa70;
  Parser *in_stack_fffffffffffffa78;
  string *in_stack_fffffffffffffaa8;
  char *in_stack_fffffffffffffab0;
  char *in_stack_fffffffffffffab8;
  char *in_stack_fffffffffffffac0;
  Parser *in_stack_fffffffffffffac8;
  string local_4e8 [32];
  string local_4c8 [32];
  long local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4a0;
  undefined8 local_498;
  string local_490 [32];
  string local_470 [32];
  string local_450 [32];
  string local_430 [32];
  long local_410;
  long local_408;
  undefined8 local_400;
  string local_3f8 [32];
  undefined8 local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3d0;
  char *local_3c8;
  allocator local_3b9;
  string local_3b8 [32];
  size_t local_398;
  long local_390;
  size_t local_388;
  Parser *local_380;
  undefined4 local_378;
  allocator local_371;
  string local_370 [32];
  size_t local_350;
  Parser *local_348;
  string local_340 [32];
  string local_320 [32];
  long local_300;
  long local_2f8;
  string local_2f0 [32];
  string local_2d0 [39];
  byte local_2a9;
  Parser *local_2a8;
  allocator local_299;
  string local_298 [48];
  Parser *local_268;
  byte local_29;
  char *local_28;
  undefined8 local_20;
  long local_18;
  char *local_10;
  
  local_18 = in_RDX;
  if (in_RSI != (char *)0x0) {
    *(undefined1 *)(in_RDI + 0x4e) = 1;
    local_10 = in_RSI;
    std::__cxx11::string::operator=
              ((string *)(in_RDI + 0x418),"Functions should match regular expression: ");
    std::__cxx11::string::operator+=((string *)(in_RDI + 0x418),local_10);
  }
  if (local_18 != 0) {
    *(undefined1 *)(in_RDI + 0x4f) = 1;
    std::__cxx11::string::operator=((string *)(in_RDI + 0x438),"Functions must not exceed: ");
    local_20 = 0x16;
    local_28 = (char *)operator_new__(0x16);
    snprintf(local_28,0x16,"%ld",local_18);
    std::__cxx11::string::operator+=((string *)(in_RDI + 0x438),local_28);
    std::__cxx11::string::operator+=((string *)(in_RDI + 0x438)," lines");
    if (local_28 != (char *)0x0) {
      operator_delete__(local_28);
    }
  }
  local_29 = 0;
  kwssys::RegularExpression::RegularExpression
            ((RegularExpression *)CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
             (char *)in_stack_fffffffffffff9e8);
  local_268 = (Parser *)
              FindFunction(in_stack_fffffffffffffac8,(size_t)in_stack_fffffffffffffac0,
                           in_stack_fffffffffffffab8);
  do {
    if (local_268 == (Parser *)0xffffffffffffffff) {
      bVar2 = local_29 ^ 0xff;
      local_378 = 1;
      kwssys::RegularExpression::~RegularExpression
                ((RegularExpression *)
                 (CONCAT17(local_29,in_stack_fffffffffffff9f0) ^ 0xff00000000000000));
      return (bool)(bVar2 & 1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_298,"",&local_299);
    std::allocator<char>::~allocator((allocator<char> *)&local_299);
    for (local_2a8 = local_268; 0 < (long)local_2a8;
        local_2a8 = (Parser *)
                    ((long)&local_2a8[-1].m_IfElseEndifList.
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)) {
      pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
      if (*pcVar3 == ')') {
        sVar4 = FindOpeningChar(in_stack_fffffffffffffa78,(char)(in_stack_fffffffffffffa70 >> 0x38),
                                (char)(in_stack_fffffffffffffa70 >> 0x30),
                                (size_t)in_stack_fffffffffffffa68,
                                SUB81(in_stack_fffffffffffffa60 >> 0x38,0));
        local_2a8 = (Parser *)(sVar4 - 1);
        break;
      }
    }
    local_2a9 = 0;
    for (; 0 < (long)local_2a8;
        local_2a8 = (Parser *)
                    ((long)&local_2a8[-1].m_IfElseEndifList.
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)) {
      pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
      if ((((*pcVar3 == ' ') ||
           (in_stack_fffffffffffffac8 = (Parser *)std::__cxx11::string::operator[](in_RDI + 0x518),
           *(char *)&(in_stack_fffffffffffffac8->m_ErrorList).
                     super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl
                     .super__Vector_impl_data._M_start == '\t')) ||
          (in_stack_fffffffffffffac0 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518),
          *in_stack_fffffffffffffac0 == '\r')) ||
         (((in_stack_fffffffffffffab8 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518),
           *in_stack_fffffffffffffab8 == '\n' ||
           (in_stack_fffffffffffffab0 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518),
           *in_stack_fffffffffffffab0 == '*')) ||
          (in_stack_fffffffffffffaa8 = (string *)std::__cxx11::string::operator[](in_RDI + 0x518),
          in_stack_fffffffffffffaa8->_M_dataplus == (_Alloc_hider)0x26)))) {
        if ((local_2a9 & 1) != 0) break;
      }
      else {
        local_2a9 = 1;
        std::__cxx11::string::operator[](in_RDI + 0x518);
        std::operator+((char)((ulong)in_stack_fffffffffffffa28 >> 0x38),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffa20);
        std::__cxx11::string::operator=(local_298,local_2d0);
        std::__cxx11::string::~string(local_2d0);
      }
    }
    GetLineNumber((Parser *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                  (size_t)in_stack_fffffffffffffa10,
                  SUB81((ulong)in_stack_fffffffffffffa08 >> 0x38,0));
    GetLine_abi_cxx11_(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
    lVar5 = std::__cxx11::string::find((char *)local_2f0,0x1e5a2a);
    if ((((lVar5 == -1) &&
         (lVar5 = std::__cxx11::string::find((char *)local_2f0,0x1e6620), lVar5 == -1)) &&
        ((((lVar5 = std::__cxx11::string::find((char *)local_2f0,0x1e662c), lVar5 == -1 &&
           (((lVar5 = std::__cxx11::string::find((char *)local_2f0,0x1e6636), lVar5 == -1 &&
             (lVar5 = std::__cxx11::string::find((char *)local_298,0x1d8c69), lVar5 == -1)) &&
            (lVar5 = std::__cxx11::string::find((char *)local_298,0x1e6751), lVar5 == -1)))) &&
          ((lVar5 = std::__cxx11::string::find((char *)local_298,0x1e6757), lVar5 == -1 &&
           (lVar5 = std::__cxx11::string::find((char *)local_298,0x1e5ca8), lVar5 == -1)))) &&
         (lVar5 = std::__cxx11::string::find((char *)local_298,0x1e5ca3), lVar5 == -1)))) &&
       (lVar5 = std::__cxx11::string::find((char *)local_298,0x1e65e9), lVar5 == -1)) {
      local_2f8 = std::__cxx11::string::find((char *)local_298,0x1e6614);
      local_300 = std::__cxx11::string::find((char *)local_298,0x1e54ca);
      if (((local_300 == -1) || (local_2f8 == -1)) || (local_300 <= local_2f8)) {
        if (local_2f8 != -1) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_340,(ulong)local_298);
          std::__cxx11::string::operator=(local_298,local_340);
          std::__cxx11::string::~string(local_340);
        }
      }
      else {
        std::__cxx11::string::substr((ulong)local_320,(ulong)local_298);
        std::__cxx11::string::operator=(local_298,local_320);
        std::__cxx11::string::~string(local_320);
      }
    }
    else {
      std::__cxx11::string::operator=(local_298,"");
    }
    uVar6 = std::__cxx11::string::empty();
    cVar1 = (char)in_RDI;
    if ((uVar6 & 1) == 0) {
      uVar6 = std::__cxx11::string::empty();
      __s = in_stack_fffffffffffff9f8;
      if ((uVar6 & 1) == 0) {
        local_380 = (Parser *)std::__cxx11::string::find(cVar1 + '\x18',0x7b);
        in_stack_fffffffffffffa60 =
             GetPositionWithComments
                       (in_stack_fffffffffffffa20,
                        CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18));
        local_388 = in_stack_fffffffffffffa60;
        local_390 = GetLineNumber((Parser *)
                                  CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                                  (size_t)in_stack_fffffffffffffa10,
                                  SUB81((ulong)in_stack_fffffffffffffa08 >> 0x38,0));
        in_stack_fffffffffffffa48 = local_380;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3b8,"",&local_3b9);
        in_stack_fffffffffffffa40 =
             FindClosingChar(in_stack_fffffffffffffac8,
                             (char)((ulong)in_stack_fffffffffffffac0 >> 0x38),
                             (char)((ulong)in_stack_fffffffffffffac0 >> 0x30),
                             (size_t)in_stack_fffffffffffffab8,
                             SUB81((ulong)in_stack_fffffffffffffab0 >> 0x38,0),
                             in_stack_fffffffffffffaa8);
        std::__cxx11::string::~string(local_3b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
        local_398 = in_stack_fffffffffffffa40;
        pcVar3 = (char *)GetPositionWithComments
                                   (in_stack_fffffffffffffa20,
                                    CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18));
        local_3c8 = pcVar3;
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                GetLineNumber((Parser *)
                              CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                              (size_t)in_stack_fffffffffffffa10,
                              SUB81((ulong)in_stack_fffffffffffffa08 >> 0x38,0));
        local_3d0 = __rhs;
        in_stack_fffffffffffffa28 =
             (Parser *)
             FindFunction(in_stack_fffffffffffffac8,(size_t)in_stack_fffffffffffffac0,
                          in_stack_fffffffffffffab8);
        local_268 = in_stack_fffffffffffffa28;
        if ((long)in_stack_fffffffffffffa28 < (long)local_398) {
          local_3d8 = std::__cxx11::string::find(cVar1 + '\x18',0x7b);
          in_stack_fffffffffffffa20 =
               (Parser *)
               FindFunction(in_stack_fffffffffffffac8,(size_t)in_stack_fffffffffffffac0,
                            in_stack_fffffffffffffab8);
          local_268 = in_stack_fffffffffffffa20;
        }
        in_stack_fffffffffffffa1f =
             kwssys::RegularExpression::find
                       ((RegularExpression *)
                        CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                        in_stack_fffffffffffff9e8);
        if (!(bool)in_stack_fffffffffffffa1f) {
          ErrorStruct::ErrorStruct((ErrorStruct *)0x1bda38);
          local_410 = local_390;
          local_408 = local_390;
          local_400 = 0x1e;
          std::operator+(pcVar3,__rhs);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff9f8,
                         (char *)CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff9f8,
                         (char *)CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0));
          in_stack_fffffffffffffa10 = local_430;
          std::__cxx11::string::operator=(local_3f8,in_stack_fffffffffffffa10);
          std::__cxx11::string::~string(in_stack_fffffffffffffa10);
          std::__cxx11::string::~string(local_450);
          std::__cxx11::string::~string(local_470);
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                    ((vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                     in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
          local_29 = 1;
          ErrorStruct::~ErrorStruct((ErrorStruct *)0x1bdb29);
        }
        __s = in_stack_fffffffffffff9f8;
        if ((((local_18 != 0) && (-1 < local_390)) && (-1 < (long)local_3d0)) &&
           (local_18 < (long)local_3d0 - local_390)) {
          ErrorStruct::ErrorStruct((ErrorStruct *)0x1bdbef);
          local_4a8 = local_390;
          local_4a0 = local_3d0;
          local_498 = 0x1f;
          std::operator+(pcVar3,__rhs);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff9f8,
                         (char *)CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0));
          in_stack_fffffffffffffa00 = local_4c8;
          std::__cxx11::string::operator=(local_490,in_stack_fffffffffffffa00);
          std::__cxx11::string::~string(in_stack_fffffffffffffa00);
          std::__cxx11::string::~string(local_4e8);
          __s = (value_type *)operator_new__(0x16);
          in_stack_fffffffffffffa08 = __s;
          snprintf((char *)__s,0x16,"%ld",(long)local_3d0 - local_390);
          std::__cxx11::string::operator+=(local_490,(char *)__s);
          std::__cxx11::string::operator+=(local_490," (");
          snprintf((char *)__s,0x16,"%ld",local_18);
          std::__cxx11::string::operator+=(local_490,(char *)__s);
          std::__cxx11::string::operator+=(local_490,")");
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                    ((vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                     in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
          local_29 = 1;
          if (__s != (value_type *)0x0) {
            operator_delete__(__s);
          }
          ErrorStruct::~ErrorStruct((ErrorStruct *)0x1bdda6);
        }
      }
      local_378 = 0;
      in_stack_fffffffffffff9f8 = __s;
    }
    else {
      in_stack_fffffffffffffa78 = (Parser *)std::__cxx11::string::find(cVar1 + '\x18',0x7b);
      local_348 = in_stack_fffffffffffffa78;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_370,"",&local_371);
      in_stack_fffffffffffffa70 =
           FindClosingChar(in_stack_fffffffffffffac8,
                           (char)((ulong)in_stack_fffffffffffffac0 >> 0x38),
                           (char)((ulong)in_stack_fffffffffffffac0 >> 0x30),
                           (size_t)in_stack_fffffffffffffab8,
                           SUB81((ulong)in_stack_fffffffffffffab0 >> 0x38,0),
                           in_stack_fffffffffffffaa8);
      std::__cxx11::string::~string(local_370);
      std::allocator<char>::~allocator((allocator<char> *)&local_371);
      local_350 = in_stack_fffffffffffffa70;
      in_stack_fffffffffffffa68 =
           (Parser *)
           FindFunction(in_stack_fffffffffffffac8,(size_t)in_stack_fffffffffffffac0,
                        in_stack_fffffffffffffab8);
      local_378 = 2;
      local_268 = in_stack_fffffffffffffa68;
    }
    std::__cxx11::string::~string(local_2f0);
    std::__cxx11::string::~string(local_298);
  } while( true );
}

Assistant:

bool Parser::CheckFunctions(const char* regEx,unsigned long maxLength)
{
  if(regEx)
    {
    m_TestsDone[FUNCTION_REGEX] = true;
    m_TestsDescription[FUNCTION_REGEX] = "Functions should match regular expression: ";
    m_TestsDescription[FUNCTION_REGEX] += regEx;
    }

  if(maxLength>0)
    {
    m_TestsDone[FUNCTION_LENGTH] = true;
    m_TestsDescription[FUNCTION_LENGTH] = "Functions must not exceed: ";
    constexpr size_t length = 22;
    char* temp = new char[length];
    snprintf(temp,length,"%ld",maxLength);
    m_TestsDescription[FUNCTION_LENGTH] += temp;
    m_TestsDescription[FUNCTION_LENGTH] += " lines";
    delete [] temp;
    }

  // First we need to find the parameters
  bool hasError = false;

  kwssys::RegularExpression regex(regEx);

  // List all the function in the file
  auto pos = static_cast<long int>(this->FindFunction(0));
  while(pos != -1)
    {
    // We extract the name of the function
    std::string functionName = "";
    // Find the ) and the openning (
    long int i=pos;
    for(;i>0;i--)
      {
      if(m_BufferNoComment[i] == ')')
        {
        i = static_cast<long int>(this->FindOpeningChar(')','(',i,true));
        i--;
        break;
        }
      }

    bool inWord = false;
    for(;i>0;i--)
      {
      if(m_BufferNoComment[i] != ' ' && m_BufferNoComment[i] != '\t'
         && m_BufferNoComment[i] != '\r' && m_BufferNoComment[i] != '\n'
         && m_BufferNoComment[i] != '*' && m_BufferNoComment[i] != '&')
        {
        inWord = true;
        functionName = m_BufferNoComment[i]+functionName;
        }
      else if(inWord)
        {
        break;
        }
      }

    // Check that this is not a #define (tricky)
    std::string functionLine = this->GetLine(this->GetLineNumber(i,true)-1);

    if(functionLine.find("#define") == std::string::npos
       && functionLine.find("_attribute_") == std::string::npos
       && functionLine.find(" operator") == std::string::npos
       && functionLine.find("friend ") == std::string::npos
       && functionName.find("if") == std::string::npos
       && functionName.find("while") == std::string::npos
       && functionName.find("for") == std::string::npos
       && functionName.find("switch") == std::string::npos
       && functionName.find("main") == std::string::npos
       && functionName.find("~") == std::string::npos // skip destructor for now...
       )
      {
      auto posf = static_cast<long int>(functionName.find("::", 0));
      auto posp = static_cast<long int>(functionName.find("(", posf));
      if(posp != -1 && posf != -1 && posp>posf)
        {
        functionName = functionName.substr(posf+2,posp-posf-2);
        }
      else if(posf != -1)
        {
        functionName = functionName.substr(posf+2,functionName.size()-posf-2);
        }
      }
    else
      {
      functionName = "";
      }

    //std::cout << "Function Name = " << functionName.c_str() << std::endl;

      if (functionName.empty()) {
        auto bf = static_cast<long int>(m_BufferNoComment.find('{', pos));
        long int pos2 =
            static_cast<long int>(this->FindClosingChar('{', '}', bf, true));
        pos = static_cast<long int>(this->FindFunction(pos2 + 1));

        // we cannot go backward
        /*if(pos2 > pos)
          {
          long int bf = m_BufferNoComment.find('{',pos2);
          pos = this->FindFunction(bf);
          }*/
        continue;
      } else if (!functionName.empty()) {
        auto bf = static_cast<long int>(m_BufferNoComment.find('{', pos));
        auto bfcomments = static_cast<long int>(GetPositionWithComments(bf));
        auto bfl = static_cast<long int>(this->GetLineNumber(bfcomments));
        long int pos2 =
            static_cast<long int>(this->FindClosingChar('{', '}', bf, true));
        auto poscomments = static_cast<long int>(GetPositionWithComments(pos2));
        long int efl = this->GetLineNumber(poscomments);

        pos = static_cast<long int>(this->FindFunction(pos2 + 1));

        // we cannot go backward
        if (pos2 > pos) {
          auto localbf =
              static_cast<long int>(m_BufferNoComment.find('{', pos2));
          pos = static_cast<long int>(this->FindFunction(localbf));
        }

      if(!regex.find(functionName))
        {
        Error error;
        error.line = bfl;
        error.line2 = error.line;
        error.number = FUNCTION_REGEX;
        error.description = "function (" + functionName + ") doesn't match regular expression: " + regEx;
        m_ErrorList.push_back(error);
        hasError = true;
        }

      if(maxLength>0)
        {
        if((bfl>-1) && (efl>-1) && (efl-bfl>(long int)maxLength))
          {
          Error error;
          error.line = bfl;
          error.line2 = efl;
          error.number = FUNCTION_LENGTH;
          error.description = "function (" + functionName + ") has too many lines: ";
          constexpr size_t length = 22;
          char* temp = new char[length];
          snprintf(temp,length,"%ld",efl-bfl);
          error.description += temp;
          error.description += " (";
          snprintf(temp,length,"%ld",maxLength);
          error.description += temp;
          error.description += ")";
          m_ErrorList.push_back(error);
          hasError = true;
          delete [] temp;
          }
        }
      }
    }

  return !hasError;
}